

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangling_pointer.cpp
# Opt level: O2

int main(void)

{
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Hellooooooooooooooo ",(allocator<char> *)&local_50);
  std::operator+(&local_50,&local_30,"World\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int main() {
  std::string s = "Hellooooooooooooooo ";
  std::string_view sv = s + "World\n";
  std::cout << sv;
}